

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_fp<unsigned_long_long>
fmt::v9::detail::normalize<0,unsigned_long_long>(basic_fp<unsigned_long_long> value)

{
  int iVar1;
  ulong uVar2;
  basic_fp<unsigned_long_long> bVar3;
  
  iVar1 = value.e + -0xb;
  for (uVar2 = value.f; (uVar2 >> 0x34 & 1) == 0; uVar2 = uVar2 * 2) {
    iVar1 = iVar1 + -1;
  }
  bVar3.f = uVar2 << 0xb;
  bVar3.e = iVar1;
  bVar3._12_4_ = 0;
  return bVar3;
}

Assistant:

FMT_CONSTEXPR basic_fp<F> normalize(basic_fp<F> value) {
  // Handle subnormals.
  const auto implicit_bit = F(1) << num_significand_bits<double>();
  const auto shifted_implicit_bit = implicit_bit << SHIFT;
  while ((value.f & shifted_implicit_bit) == 0) {
    value.f <<= 1;
    --value.e;
  }
  // Subtract 1 to account for hidden bit.
  const auto offset = basic_fp<F>::num_significand_bits -
                      num_significand_bits<double>() - SHIFT - 1;
  value.f <<= offset;
  value.e -= offset;
  return value;
}